

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniNoSubFailure_Test::~TApp_IniNoSubFailure_Test(TApp_IniNoSubFailure_Test *this)

{
  TApp_IniNoSubFailure_Test *this_local;
  
  ~TApp_IniNoSubFailure_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniNoSubFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[other]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}